

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::SomeFileOverlapsRange
               (InternalKeyComparator *icmp,bool disjoint_sorted_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               Slice *smallest_user_key,Slice *largest_user_key)

{
  bool bVar1;
  Comparator *ucmp_00;
  FileMetaData *pFVar2;
  const_reference ppFVar3;
  ulong uVar4;
  size_type sVar5;
  Slice local_88;
  undefined1 local_78 [8];
  InternalKey small_key;
  uint32_t index;
  FileMetaData *f;
  size_t i;
  Comparator *ucmp;
  Slice *largest_user_key_local;
  Slice *smallest_user_key_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files_local;
  bool disjoint_sorted_files_local;
  InternalKeyComparator *icmp_local;
  
  ucmp_00 = InternalKeyComparator::user_comparator(icmp);
  if (disjoint_sorted_files) {
    small_key._28_4_ = 0;
    if (smallest_user_key != (Slice *)0x0) {
      InternalKey::InternalKey
                ((InternalKey *)local_78,smallest_user_key,0xffffffffffffff,kTypeValue);
      local_88 = InternalKey::Encode((InternalKey *)local_78);
      small_key._28_4_ = FindFile(icmp,files,&local_88);
      InternalKey::~InternalKey((InternalKey *)local_78);
    }
    uVar4 = (ulong)(uint)small_key._28_4_;
    sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (files);
    if (uVar4 < sVar5) {
      ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](files,(ulong)(uint)small_key._28_4_);
      bVar1 = BeforeFile(ucmp_00,largest_user_key,*ppFVar3);
      icmp_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
    else {
      icmp_local._7_1_ = false;
    }
  }
  else {
    for (f = (FileMetaData *)0x0;
        pFVar2 = (FileMetaData *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(files), f < pFVar2; f = (FileMetaData *)((long)&f->refs + 1)) {
      ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](files,(size_type)f);
      pFVar2 = *ppFVar3;
      bVar1 = AfterFile(ucmp_00,smallest_user_key,pFVar2);
      if ((!bVar1) && (bVar1 = BeforeFile(ucmp_00,largest_user_key,pFVar2), !bVar1)) {
        return true;
      }
    }
    icmp_local._7_1_ = false;
  }
  return icmp_local._7_1_;
}

Assistant:

bool SomeFileOverlapsRange(const InternalKeyComparator& icmp,
                           bool disjoint_sorted_files,
                           const std::vector<FileMetaData*>& files,
                           const Slice* smallest_user_key,
                           const Slice* largest_user_key) {
  const Comparator* ucmp = icmp.user_comparator();
  if (!disjoint_sorted_files) {
    // Need to check against all files
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      if (AfterFile(ucmp, smallest_user_key, f) ||
          BeforeFile(ucmp, largest_user_key, f)) {
        // No overlap
      } else {
        return true;  // Overlap
      }
    }
    return false;
  }

  // Binary search over file list
  uint32_t index = 0;
  if (smallest_user_key != nullptr) {
    // Find the earliest possible internal key for smallest_user_key
    InternalKey small_key(*smallest_user_key, kMaxSequenceNumber,
                          kValueTypeForSeek);
    index = FindFile(icmp, files, small_key.Encode());
  }

  if (index >= files.size()) {
    // beginning of range is after all files, so no overlap.
    return false;
  }

  return !BeforeFile(ucmp, largest_user_key, files[index]);
}